

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

int __thiscall
djb::fresnel::sgd::clone(sgd *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  sgd *this_00;
  sgd *this_local;
  
  this_00 = (sgd *)operator_new(0x28);
  sgd(this_00,this);
  return (int)this_00;
}

Assistant:

impl *clone() const {return new sgd(*this);}